

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

Status __thiscall HighsMipSolverData::evaluateRootLp(HighsMipSolverData *this)

{
  bool bVar1;
  bool bVar2;
  Status status_00;
  Highs *pHVar3;
  HighsModelStatus *pHVar4;
  int64_t iVar5;
  int64_t iVar6;
  double *pdVar7;
  HighsSolution *pHVar8;
  long *in_RDI;
  double dVar9;
  HighsMipSolverData *unaff_retaddr;
  HighsMipSolver *in_stack_00000028;
  HighsRedcostFixing *in_stack_00000030;
  HighsMipSolverData *in_stack_00000040;
  bool bound_change_3;
  double prev_lower_bound_3;
  bool bound_change_2;
  double prev_lower_bound_2;
  bool bound_change_1;
  double prev_lower_bound_1;
  int64_t lpIters;
  Status status;
  bool lpWasSolved;
  bool lpBoundsChanged;
  HighsMipSolver *in_stack_000000b8;
  HighsRedcostFixing *in_stack_000000c0;
  bool bound_change;
  double prev_lower_bound;
  HighsDomain *in_stack_000001b8;
  HighsDomain *in_stack_000003b0;
  HighsLpRelaxation *in_stack_000003b8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  HighsCDouble local_b8;
  undefined1 local_a1;
  double in_stack_ffffffffffffff60;
  HighsDomain *in_stack_ffffffffffffff68;
  HighsLpRelaxation *in_stack_ffffffffffffff70;
  double local_88;
  undefined2 local_70;
  undefined1 in_stack_ffffffffffffff92;
  undefined1 in_stack_ffffffffffffff93;
  int in_stack_ffffffffffffff94;
  double in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  HighsMipSolverData *in_stack_ffffffffffffffa8;
  HighsDomain *in_stack_ffffffffffffffb0;
  StabilizerOrbits *in_stack_ffffffffffffffb8;
  Status local_38;
  double local_30;
  undefined6 local_28;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  double in_stack_ffffffffffffffe8;
  long *to_lower_bound;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  to_lower_bound = in_RDI;
  do {
    HighsDomain::propagate(in_stack_000001b8);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0xcc2));
    if ((bVar2) && (bVar2 = HighsDomain::infeasible((HighsDomain *)(in_RDI + 0x72)), !bVar2)) {
      std::__shared_ptr_access<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x62ab7a);
      StabilizerOrbits::orbitalFixing(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    }
    bVar2 = HighsDomain::infeasible((HighsDomain *)(in_RDI + 0x72));
    if (bVar2) {
      dVar9 = (double)in_RDI[0xcf7];
      pdVar7 = std::min<double>((double *)&kHighsInf,(double *)(in_RDI + 0xcf8));
      in_RDI[0xcf7] = (long)*pdVar7;
      if (((*(byte *)(*in_RDI + 0xb0) & 1) == 0) && ((double)in_RDI[0xcf7] != dVar9)) {
        updatePrimalDualIntegral
                  (unaff_retaddr,
                   (double)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   (double)to_lower_bound,dVar9,
                   (double)CONCAT17((double)in_RDI[0xcf7] != dVar9,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde);
      }
      HighsCDouble::HighsCDouble((HighsCDouble *)&local_30,1.0);
      in_RDI[0xce0] = (long)local_30;
      in_RDI[0xce1] =
           CONCAT17(in_stack_ffffffffffffffdf,CONCAT16(in_stack_ffffffffffffffde,local_28));
      in_RDI[0xce6] = in_RDI[0xce6] + 1;
      in_RDI[0xce7] = in_RDI[0xce7] + 1;
      return kInfeasible;
    }
    HighsDomain::getChangedCols((HighsDomain *)(in_RDI + 0x72));
    bVar2 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30);
    if (!bVar2) {
      removeFixedIndices(in_stack_00000040);
      HighsLpRelaxation::flushDomain
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 SUB81((ulong)in_stack_ffffffffffffff60 >> 0x38,0));
    }
    bVar1 = false;
    if (!bVar2) {
LAB_0062ad44:
      iVar5 = HighsLpRelaxation::getNumLpIterations((HighsLpRelaxation *)(in_RDI + 0xd9));
      local_38 = HighsLpRelaxation::resolveLp(in_stack_000003b8,in_stack_000003b0);
      iVar6 = HighsLpRelaxation::getNumLpIterations((HighsLpRelaxation *)(in_RDI + 0xd9));
      in_RDI[0xced] = (iVar6 - iVar5) + in_RDI[0xced];
      dVar9 = HighsLpRelaxation::getAvgSolveIters((HighsLpRelaxation *)(in_RDI + 0xd9));
      in_RDI[0xce2] = (long)dVar9;
      bVar1 = true;
      if (local_38 == kUnbounded) {
        bVar2 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff30);
        if (bVar2) {
          *(undefined4 *)(*in_RDI + 0x20) = 9;
        }
        else {
          *(undefined4 *)(*in_RDI + 0x20) = 10;
        }
        HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xffffffffffffffb0,1.0);
        in_RDI[0xce0] = (long)in_stack_ffffffffffffffb0;
        in_RDI[0xce1] = (long)in_stack_ffffffffffffffb8;
        in_RDI[0xce6] = in_RDI[0xce6] + 1;
        in_RDI[0xce7] = in_RDI[0xce7] + 1;
        return kUnbounded;
      }
      if (local_38 == kOptimal) {
        HighsLpRelaxation::getFractionalIntegers((HighsLpRelaxation *)(in_RDI + 0xd9));
        bVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::empty
                          ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            *)in_stack_ffffffffffffff30);
        if (bVar2) {
          pHVar3 = HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)(in_RDI + 0xd9));
          Highs::getSolution(pHVar3);
          HighsLpRelaxation::getObjective((HighsLpRelaxation *)(in_RDI + 0xd9));
          bVar2 = addIncumbent(in_stack_ffffffffffffffa8,
                               (vector<double,_std::allocator<double>_> *)
                               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                               (bool)in_stack_ffffffffffffff93,(bool)in_stack_ffffffffffffff92);
          if (bVar2) {
            *(undefined4 *)(*in_RDI + 0x20) = 7;
            dVar9 = (double)in_RDI[0xcf7];
            in_RDI[0xcf7] = in_RDI[0xcf8];
            if (((*(byte *)(*in_RDI + 0xb0) & 1) == 0) && ((double)in_RDI[0xcf7] != dVar9)) {
              updatePrimalDualIntegral
                        (unaff_retaddr,
                         (double)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (double)to_lower_bound,in_stack_ffffffffffffffe8,
                         (double)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                         (bool)in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde);
            }
            HighsCDouble::HighsCDouble((HighsCDouble *)&local_70,1.0);
            in_RDI[0xce0] =
                 CONCAT44(in_stack_ffffffffffffff94,
                          CONCAT13(in_stack_ffffffffffffff93,
                                   CONCAT12(in_stack_ffffffffffffff92,local_70)));
            in_RDI[0xce1] = (long)in_stack_ffffffffffffff98;
            in_RDI[0xce6] = in_RDI[0xce6] + 1;
            in_RDI[0xce7] = in_RDI[0xce7] + 1;
            return kInfeasible;
          }
        }
      }
    }
    else {
      pHVar3 = HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)(in_RDI + 0xd9));
      pHVar4 = Highs::getModelStatus(pHVar3);
      if (*pHVar4 == kMin) goto LAB_0062ad44;
      local_38 = HighsLpRelaxation::getStatus((HighsLpRelaxation *)(in_RDI + 0xd9));
    }
    if (local_38 == kInfeasible) {
      dVar9 = (double)in_RDI[0xcf7];
      pdVar7 = std::min<double>((double *)&kHighsInf,(double *)(in_RDI + 0xcf8));
      in_RDI[0xcf7] = (long)*pdVar7;
      if (((*(byte *)(*in_RDI + 0xb0) & 1) == 0) && ((double)in_RDI[0xcf7] != dVar9)) {
        updatePrimalDualIntegral
                  (unaff_retaddr,
                   (double)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   (double)to_lower_bound,in_stack_ffffffffffffffe8,
                   (double)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde);
      }
      HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xffffffffffffff70,1.0);
      in_RDI[0xce0] = (long)in_stack_ffffffffffffff70;
      in_RDI[0xce1] = (long)local_88;
      in_RDI[0xce6] = in_RDI[0xce6] + 1;
      in_RDI[0xce7] = in_RDI[0xce7] + 1;
      return kInfeasible;
    }
    status_00 = HighsLpRelaxation::getStatus((HighsLpRelaxation *)(in_RDI + 0xd9));
    bVar2 = HighsLpRelaxation::unscaledDualFeasible(status_00);
    if (bVar2) {
      in_stack_ffffffffffffff68 = (HighsDomain *)in_RDI[0xcf7];
      in_stack_ffffffffffffff60 =
           HighsLpRelaxation::getObjective((HighsLpRelaxation *)(in_RDI + 0xd9));
      pdVar7 = std::max<double>((double *)&stack0xffffffffffffff60,(double *)(in_RDI + 0xcf7));
      in_RDI[0xcf7] = (long)*pdVar7;
      local_a1 = (double)in_RDI[0xcf7] != (double)in_stack_ffffffffffffff68;
      if (((*(byte *)(*in_RDI + 0xb0) & 1) == 0) && ((bool)local_a1)) {
        updatePrimalDualIntegral
                  (unaff_retaddr,
                   (double)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   (double)to_lower_bound,in_stack_ffffffffffffffe8,
                   (double)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf,(bool)in_stack_ffffffffffffffde);
      }
      if (bVar1) {
        pHVar3 = HighsLpRelaxation::getLpSolver((HighsLpRelaxation *)(in_RDI + 0xd9));
        pHVar8 = Highs::getSolution(pHVar3);
        in_stack_ffffffffffffff30 = &pHVar8->col_dual;
        HighsLpRelaxation::getObjective((HighsLpRelaxation *)(in_RDI + 0xd9));
        HighsRedcostFixing::addRootRedcost
                  (in_stack_000000c0,in_stack_000000b8,_status,(double)lpIters);
        if (((double)in_RDI[0xcf9] != INFINITY) || (NAN((double)in_RDI[0xcf9]))) {
          HighsRedcostFixing::propagateRootRedcost(in_stack_00000030,in_stack_00000028);
        }
      }
    }
    if ((double)in_RDI[0xcfa] <= (double)in_RDI[0xcf7] &&
        (double)in_RDI[0xcf7] != (double)in_RDI[0xcfa]) {
      HighsCDouble::HighsCDouble(&local_b8,1.0);
      in_RDI[0xce0] = (long)local_b8.hi;
      in_RDI[0xce1] = (long)local_b8.lo;
      in_RDI[0xce6] = in_RDI[0xce6] + 1;
      in_RDI[0xce7] = in_RDI[0xce7] + 1;
      return kInfeasible;
    }
    HighsDomain::getChangedCols((HighsDomain *)(in_RDI + 0x72));
    bVar2 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30);
    if (bVar2) {
      return local_38;
    }
  } while( true );
}

Assistant:

HighsLpRelaxation::Status HighsMipSolverData::evaluateRootLp() {
  do {
    domain.propagate();

    if (globalOrbits && !domain.infeasible())
      globalOrbits->orbitalFixing(domain);

    if (domain.infeasible()) {
      double prev_lower_bound = lower_bound;

      lower_bound = std::min(kHighsInf, upper_bound);

      bool bound_change = lower_bound != prev_lower_bound;
      if (!mipsolver.submip && bound_change)
        updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                                 upper_bound);
      pruned_treeweight = 1.0;
      num_nodes += 1;
      num_leaves += 1;
      return HighsLpRelaxation::Status::kInfeasible;
    }

    bool lpBoundsChanged = false;
    if (!domain.getChangedCols().empty()) {
      lpBoundsChanged = true;
      removeFixedIndices();
      lp.flushDomain(domain);
    }

    bool lpWasSolved = false;
    HighsLpRelaxation::Status status;
    if (lpBoundsChanged ||
        lp.getLpSolver().getModelStatus() == HighsModelStatus::kNotset) {
      int64_t lpIters = -lp.getNumLpIterations();
      status = lp.resolveLp(&domain);
      lpIters += lp.getNumLpIterations();
      total_lp_iterations += lpIters;
      avgrootlpiters = lp.getAvgSolveIters();
      lpWasSolved = true;

      if (status == HighsLpRelaxation::Status::kUnbounded) {
        if (mipsolver.solution_.empty())
          mipsolver.modelstatus_ = HighsModelStatus::kUnboundedOrInfeasible;
        else
          mipsolver.modelstatus_ = HighsModelStatus::kUnbounded;

        pruned_treeweight = 1.0;
        num_nodes += 1;
        num_leaves += 1;
        return status;
      }

      if (status == HighsLpRelaxation::Status::kOptimal &&
          lp.getFractionalIntegers().empty() &&
          addIncumbent(lp.getLpSolver().getSolution().col_value,
                       lp.getObjective(), kSolutionSourceEvaluateNode)) {
        mipsolver.modelstatus_ = HighsModelStatus::kOptimal;

        double prev_lower_bound = lower_bound;

        lower_bound = upper_bound;

        bool bound_change = lower_bound != prev_lower_bound;
        if (!mipsolver.submip && bound_change)
          updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                                   upper_bound);
        pruned_treeweight = 1.0;
        num_nodes += 1;
        num_leaves += 1;
        return HighsLpRelaxation::Status::kInfeasible;
      }
    } else
      status = lp.getStatus();

    if (status == HighsLpRelaxation::Status::kInfeasible) {
      double prev_lower_bound = lower_bound;

      lower_bound = std::min(kHighsInf, upper_bound);

      bool bound_change = lower_bound != prev_lower_bound;
      if (!mipsolver.submip && bound_change)
        updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                                 upper_bound);
      pruned_treeweight = 1.0;
      num_nodes += 1;
      num_leaves += 1;
      return status;
    }

    if (lp.unscaledDualFeasible(lp.getStatus())) {
      double prev_lower_bound = lower_bound;

      lower_bound = std::max(lp.getObjective(), lower_bound);

      bool bound_change = lower_bound != prev_lower_bound;
      if (!mipsolver.submip && bound_change)
        updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                                 upper_bound);

      if (lpWasSolved) {
        redcostfixing.addRootRedcost(mipsolver,
                                     lp.getLpSolver().getSolution().col_dual,
                                     lp.getObjective());
        if (upper_limit != kHighsInf)
          redcostfixing.propagateRootRedcost(mipsolver);
      }
    }

    if (lower_bound > optimality_limit) {
      pruned_treeweight = 1.0;
      num_nodes += 1;
      num_leaves += 1;
      return HighsLpRelaxation::Status::kInfeasible;
    }

    if (domain.getChangedCols().empty()) return status;
  } while (true);
}